

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3_sse41.c
# Opt level: O1

void blake3_compress_xof_sse41
               (uint32_t *cv,uint8_t *block,uint8_t block_len,uint64_t counter,uint8_t flags,
               uint8_t *out)

{
  undefined1 auVar1 [16];
  undefined3 in_register_00000011;
  undefined3 in_register_00000081;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  auVar16 = vpinsrb_avx(ZEXT416(CONCAT31(in_register_00000011,block_len)),
                        CONCAT31(in_register_00000081,flags),4);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = counter;
  auVar11 = vpunpcklqdq_avx(auVar13,auVar16);
  auVar16 = *(undefined1 (*) [16])block;
  auVar13 = *(undefined1 (*) [16])(block + 0x10);
  auVar1 = *(undefined1 (*) [16])(block + 0x20);
  auVar18 = *(undefined1 (*) [16])(block + 0x30);
  auVar7 = vshufps_avx(auVar16,auVar13,0x88);
  auVar17 = vpaddd_avx(*(undefined1 (*) [16])(cv + 4),*(undefined1 (*) [16])cv);
  auVar17 = vpaddd_avx(auVar17,auVar7);
  auVar2 = vprold_avx512vl(auVar17 ^ auVar11,0x10);
  auVar11 = vpaddd_avx(auVar2,_DAT_001abb80);
  auVar3 = vprold_avx512vl(auVar11 ^ *(undefined1 (*) [16])(cv + 4),0x14);
  auVar14 = vshufps_avx(auVar16,auVar13,0xdd);
  auVar17 = vpaddd_avx(auVar17,auVar14);
  auVar17 = vpaddd_avx(auVar17,auVar3);
  auVar2 = vprold_avx512vl(auVar2 ^ auVar17,0x18);
  auVar11 = vpaddd_avx(auVar11,auVar2);
  auVar3 = vprold_avx512vl(auVar11 ^ auVar3,0x19);
  auVar2 = vpshufd_avx(auVar2,0x4e);
  auVar11 = vpshufd_avx(auVar11,0x39);
  auVar15 = vshufps_avx(auVar1,auVar18,0x88);
  auVar17 = vpaddd_avx(auVar15,auVar17);
  auVar17 = vpshufd_avx(auVar17,0x93);
  auVar17 = vpaddd_avx(auVar3,auVar17);
  auVar2 = vprold_avx512vl(auVar2 ^ auVar17,0x10);
  auVar11 = vpaddd_avx(auVar11,auVar2);
  auVar3 = vprold_avx512vl(auVar11 ^ auVar3,0x14);
  auVar6 = vshufps_avx(auVar1,auVar18,0x7d);
  auVar9 = vshufps_avx(auVar6,auVar6,0xd2);
  auVar17 = vpaddd_avx(auVar9,auVar17);
  auVar17 = vpaddd_avx(auVar17,auVar3);
  auVar2 = vprold_avx512vl(auVar2 ^ auVar17,0x18);
  auVar11 = vpaddd_avx(auVar11,auVar2);
  auVar4 = vprold_avx512vl(auVar11 ^ auVar3,0x19);
  auVar2 = vpshufd_avx(auVar2,0x4e);
  auVar3 = vpshufd_avx(auVar11,0x93);
  auVar10 = vshufps_avx(auVar7,auVar14,0xd6);
  auVar17 = vpaddd_avx(auVar10,auVar17);
  auVar17 = vpshufd_avx(auVar17,0x39);
  auVar11 = vpaddd_avx(auVar4,auVar17);
  auVar5 = vprold_avx512vl(auVar2 ^ auVar11,0x10);
  auVar2 = vpaddd_avx(auVar3,auVar5);
  auVar3 = vprold_avx512vl(auVar2 ^ auVar4,0x14);
  auVar17 = vinsertps_avx(auVar6,auVar1,0x95);
  auVar6 = vpermi2ps_avx512vl(_DAT_001abca0,auVar7,auVar17);
  auVar11 = vpaddd_avx(auVar6,auVar11);
  auVar11 = vpaddd_avx(auVar3,auVar11);
  auVar7 = vprold_avx512vl(auVar5 ^ auVar11,0x18);
  auVar2 = vpaddd_avx(auVar2,auVar7);
  auVar4 = vprold_avx512vl(auVar2 ^ auVar3,0x19);
  auVar3 = vpshufd_avx(auVar11,0x93);
  auVar7 = vpshufd_avx(auVar7,0x4e);
  auVar2 = vpshufd_avx(auVar2,0x39);
  auVar11 = vmovlhps_avx(auVar9,auVar14);
  auVar5 = vpermi2ps_avx512vl(_DAT_001abcb0,auVar11,auVar18);
  auVar11 = vpaddd_avx(auVar5,auVar3);
  auVar11 = vpaddd_avx(auVar4,auVar11);
  auVar7 = vprold_avx512vl(auVar11 ^ auVar7,0x10);
  auVar2 = vpaddd_avx(auVar2,auVar7);
  auVar4 = vprold_avx512vl(auVar2 ^ auVar4,0x14);
  auVar3 = vunpckhps_avx(auVar14,auVar9);
  auVar8 = vpermi2ps_avx512vl(_DAT_001abcc0,auVar15,auVar3);
  auVar11 = vpaddd_avx(auVar11,auVar8);
  auVar11 = vpaddd_avx(auVar11,auVar4);
  auVar3 = vprold_avx512vl(auVar11 ^ auVar7,0x18);
  auVar2 = vpaddd_avx(auVar2,auVar3);
  auVar7 = vprold_avx512vl(auVar2 ^ auVar4,0x19);
  auVar3 = vpshufd_avx(auVar3,0x4e);
  auVar2 = vpshufd_avx(auVar2,0x93);
  auVar14 = vshufps_avx(auVar14,auVar17,0xd7);
  auVar11 = vpaddd_avx(auVar11,auVar14);
  auVar11 = vpshufd_avx(auVar11,0x39);
  auVar11 = vpaddd_avx(auVar7,auVar11);
  auVar3 = vprold_avx512vl(auVar11 ^ auVar3,0x10);
  auVar2 = vpaddd_avx(auVar2,auVar3);
  auVar7 = vprold_avx512vl(auVar2 ^ auVar7,0x14);
  auVar15 = vshufps_avx(auVar10,auVar10,0x18);
  auVar9 = vpermi2ps_avx512vl(_DAT_001abcd0,auVar15,auVar18);
  auVar11 = vpaddd_avx(auVar9,auVar11);
  auVar11 = vpaddd_avx(auVar7,auVar11);
  auVar9 = vprold_avx512vl(auVar3 ^ auVar11,0x18);
  auVar2 = vpaddd_avx(auVar2,auVar9);
  auVar10 = vprold_avx512vl(auVar2 ^ auVar7,0x19);
  auVar3 = vpshufd_avx(auVar11,0x93);
  auVar7 = vpshufd_avx(auVar9,0x4e);
  auVar2 = vpshufd_avx(auVar2,0x39);
  auVar11 = vmovlhps_avx(auVar8,auVar6);
  auVar4 = vpermt2ps_avx512vl(auVar11,_DAT_001abce0,auVar1);
  auVar11 = vpaddd_avx(auVar3,auVar4);
  auVar11 = vpaddd_avx(auVar11,auVar10);
  auVar3 = vprold_avx512vl(auVar11 ^ auVar7,0x10);
  auVar2 = vpaddd_avx(auVar2,auVar3);
  auVar7 = vprold_avx512vl(auVar2 ^ auVar10,0x14);
  auVar13 = vblendps_avx(auVar16,auVar13,2);
  auVar10 = vunpcklps_avx(auVar5,auVar13);
  auVar6 = vshufps_avx(auVar10,auVar10,0x1e);
  auVar13 = vpaddd_avx(auVar11,auVar6);
  auVar13 = vpaddd_avx(auVar13,auVar7);
  auVar3 = vprold_avx512vl(auVar13 ^ auVar3,0x18);
  auVar11 = vpaddd_avx(auVar2,auVar3);
  auVar7 = vprold_avx512vl(auVar11 ^ auVar7,0x19);
  auVar2 = vpshufd_avx(auVar3,0x4e);
  auVar3 = vpshufd_avx(auVar11,0x93);
  auVar9 = vshufps_avx(auVar17,auVar18,0x87);
  auVar13 = vpaddd_avx(auVar13,auVar9);
  auVar13 = vpshufd_avx(auVar13,0x39);
  auVar11 = vpaddd_avx(auVar7,auVar13);
  auVar2 = vprold_avx512vl(auVar11 ^ auVar2,0x10);
  auVar3 = vpaddd_avx512vl(auVar3,auVar2);
  auVar7 = vprold_avx512vl(auVar3 ^ auVar7,0x14);
  auVar17 = vinsertps_avx(auVar6,auVar1,0x55);
  auVar14 = vshufps_avx(auVar14,auVar14,0x18);
  auVar13 = vblendps_avx(auVar14,auVar17,10);
  auVar13 = vpaddd_avx(auVar11,auVar13);
  auVar13 = vpaddd_avx(auVar13,auVar7);
  auVar11 = vpxorq_avx512vl(auVar2,auVar13);
  auVar5 = vprold_avx512vl(auVar11,0x18);
  auVar11 = vpaddd_avx(auVar3,auVar5);
  auVar12 = vprold_avx512vl(auVar11 ^ auVar7,0x19);
  auVar2 = vpshufd_avx(auVar13,0x93);
  auVar3 = vpshufd_avx(auVar5,0x4e);
  auVar7 = vpshufd_avx(auVar11,0x39);
  auVar13 = vmovlhps_avx(auVar6,auVar15);
  auVar5 = vpermt2d_avx512vl(auVar13,_DAT_001abce0,auVar8);
  auVar13 = vpaddd_avx(auVar2,auVar5);
  auVar11 = vpaddd_avx(auVar12,auVar13);
  auVar3 = vprold_avx512vl(auVar11 ^ auVar3,0x10);
  auVar2 = vpaddd_avx(auVar7,auVar3);
  auVar7 = vprold_avx512vl(auVar2 ^ auVar12,0x14);
  auVar13 = vinsertps_avx(auVar10,auVar16,0x8c);
  auVar13 = vunpcklps_avx(auVar4,auVar13);
  auVar15 = vshufps_avx(auVar13,auVar13,0x1e);
  auVar13 = vpaddd_avx(auVar11,auVar15);
  auVar13 = vpaddd_avx(auVar13,auVar7);
  auVar3 = vprold_avx512vl(auVar3 ^ auVar13,0x18);
  auVar11 = vpaddd_avx(auVar2,auVar3);
  auVar7 = vprold_avx512vl(auVar11 ^ auVar7,0x19);
  auVar3 = vpshufd_avx(auVar3,0x4e);
  auVar11 = vpshufd_avx(auVar11,0x93);
  auVar10 = vshufps_avx(auVar18,auVar17,0xd2);
  auVar13 = vpaddd_avx(auVar13,auVar10);
  auVar13 = vpshufd_avx(auVar13,0x39);
  auVar2 = vpaddd_avx(auVar7,auVar13);
  auVar4 = vprold_avx512vl(auVar2 ^ auVar3,0x10);
  auVar3 = vpaddd_avx(auVar11,auVar4);
  auVar7 = vprold_avx512vl(auVar3 ^ auVar7,0x14);
  auVar11 = vinsertps_avx(auVar15,auVar5,0x95);
  auVar9 = vshufps_avx(auVar9,auVar9,0x18);
  auVar13 = vblendps_avx(auVar9,auVar11,10);
  auVar13 = vpaddd_avx(auVar2,auVar13);
  auVar2 = vpaddd_avx512vl(auVar13,auVar7);
  auVar4 = vprold_avx512vl(auVar4 ^ auVar2,0x18);
  auVar13 = vpaddd_avx(auVar3,auVar4);
  auVar3 = vpxord_avx512vl(auVar13,auVar7);
  auVar8 = vprold_avx512vl(auVar3,0x19);
  auVar2 = vpshufd_avx(auVar2,0x93);
  auVar3 = vpshufd_avx(auVar4,0x4e);
  auVar7 = vpshufd_avx(auVar13,0x39);
  auVar13 = vmovlhps_avx512f(auVar15,auVar14);
  auVar6 = vpermt2d_avx512vl(auVar13,_DAT_001abce0,auVar6);
  auVar13 = vpaddd_avx512vl(auVar2,auVar6);
  auVar13 = vpaddd_avx(auVar8,auVar13);
  auVar3 = vprold_avx512vl(auVar3 ^ auVar13,0x10);
  auVar2 = vpaddd_avx(auVar7,auVar3);
  auVar7 = vprold_avx512vl(auVar2 ^ auVar8,0x14);
  auVar4 = vpermi2ps_avx512vl(_DAT_001abcf0,auVar5,auVar16);
  auVar13 = vpaddd_avx(auVar13,auVar4);
  auVar13 = vpaddd_avx(auVar7,auVar13);
  auVar3 = vprold_avx512vl(auVar3 ^ auVar13,0x18);
  auVar2 = vpaddd_avx(auVar2,auVar3);
  auVar14 = vprold_avx512vl(auVar2 ^ auVar7,0x19);
  auVar3 = vpshufd_avx(auVar3,0x4e);
  auVar2 = vpshufd_avx(auVar2,0x93);
  auVar7 = vshufps_avx(auVar17,auVar11,0xd7);
  auVar13 = vpaddd_avx(auVar7,auVar13);
  auVar13 = vpshufd_avx(auVar13,0x39);
  auVar17 = vpaddd_avx(auVar14,auVar13);
  auVar5 = vprold_avx512vl(auVar17 ^ auVar3,0x10);
  auVar11 = vpaddd_avx(auVar2,auVar5);
  auVar2 = vprold_avx512vl(auVar11 ^ auVar14,0x14);
  auVar14 = vinsertps_avx512f(auVar4,auVar6,0x95);
  auVar3 = vshufps_avx(auVar10,auVar10,0x18);
  auVar13 = vblendps_avx(auVar3,auVar14,10);
  auVar13 = vpaddd_avx(auVar17,auVar13);
  auVar13 = vpaddd_avx(auVar13,auVar2);
  auVar10 = vprold_avx512vl(auVar5 ^ auVar13,0x18);
  auVar17 = vpaddd_avx(auVar11,auVar10);
  auVar5 = vprold_avx512vl(auVar17 ^ auVar2,0x19);
  auVar11 = vpshufd_avx(auVar13,0x93);
  auVar2 = vpshufd_avx(auVar10,0x4e);
  auVar17 = vpshufd_avx(auVar17,0x39);
  auVar13 = vmovlhps_avx(auVar4,auVar9);
  auVar15 = vpermt2d_avx512vl(auVar13,_DAT_001abce0,auVar15);
  auVar13 = vpaddd_avx(auVar11,auVar15);
  auVar13 = vpaddd_avx(auVar5,auVar13);
  auVar11 = vprold_avx512vl(auVar2 ^ auVar13,0x10);
  auVar17 = vpaddd_avx(auVar17,auVar11);
  auVar9 = vprold_avx512vl(auVar17 ^ auVar5,0x14);
  auVar2._8_8_ = 0x700000002;
  auVar2._0_8_ = 0x700000002;
  auVar16 = vpermi2ps_avx512vl(auVar2,auVar1,auVar16);
  auVar6 = vunpcklps_avx512vl(auVar6,auVar16);
  auVar2 = vshufps_avx(auVar6,auVar6,0x1e);
  auVar16 = vpaddd_avx(auVar2,auVar13);
  auVar16 = vpaddd_avx(auVar9,auVar16);
  auVar11 = vprold_avx512vl(auVar11 ^ auVar16,0x18);
  auVar13 = vpaddd_avx(auVar17,auVar11);
  auVar9 = vprold_avx512vl(auVar13 ^ auVar9,0x19);
  auVar17 = vpshufd_avx(auVar11,0x4e);
  auVar11 = vpshufd_avx(auVar13,0x93);
  auVar16 = vpshufd_avx(auVar16,0x39);
  auVar13 = vpermi2ps_avx512vl(_DAT_001abd00,auVar1,auVar14);
  auVar16 = vpaddd_avx(auVar13,auVar16);
  auVar13 = vpaddd_avx(auVar9,auVar16);
  auVar17 = vprold_avx512vl(auVar17 ^ auVar13,0x10);
  auVar1 = vpaddd_avx(auVar11,auVar17);
  auVar11 = vprold_avx512vl(auVar9 ^ auVar1,0x14);
  auVar16 = vinsertps_avx(auVar2,auVar15,0x95);
  auVar16 = vpermi2ps_avx512vl(_DAT_001abd10,auVar7,auVar16);
  auVar16 = vpaddd_avx(auVar16,auVar13);
  auVar16 = vpaddd_avx(auVar11,auVar16);
  auVar17 = vprold_avx512vl(auVar17 ^ auVar16,0x18);
  auVar13 = vpaddd_avx(auVar1,auVar17);
  auVar7 = vprold_avx512vl(auVar11 ^ auVar13,0x19);
  auVar1 = vpshufd_avx(auVar16,0x93);
  auVar17 = vpshufd_avx(auVar17,0x4e);
  auVar11 = vpshufd_avx(auVar13,0x39);
  auVar16 = vmovlhps_avx(auVar2,auVar3);
  auVar16 = vpermt2d_avx512vl(auVar16,_DAT_001abce0,auVar4);
  auVar16 = vpaddd_avx(auVar1,auVar16);
  auVar13 = vpaddd_avx(auVar7,auVar16);
  auVar17 = vprold_avx512vl(auVar13 ^ auVar17,0x10);
  auVar1 = vpaddd_avx(auVar11,auVar17);
  auVar11 = vprold_avx512vl(auVar7 ^ auVar1,0x14);
  auVar16 = vblendps_avx(auVar18,auVar6,2);
  auVar18 = vpmovsxbd_avx(ZEXT416(0x40501));
  auVar16 = vpermi2d_avx512vl(auVar18,auVar15,auVar16);
  auVar16 = vpaddd_avx(auVar13,auVar16);
  auVar16 = vpaddd_avx(auVar16,auVar11);
  auVar18 = vprold_avx512vl(auVar17 ^ auVar16,0x18);
  auVar13 = vpaddd_avx(auVar1,auVar18);
  auVar17 = vprold_avx512vl(auVar13 ^ auVar11,0x19);
  auVar16 = vpshufd_avx(auVar16,0x39);
  auVar1 = vpshufd_avx(auVar18,0x4e);
  auVar13 = vpshufd_avx(auVar13,0x93);
  *(undefined1 (*) [16])out = auVar13 ^ auVar16;
  *(undefined1 (*) [16])(out + 0x10) = auVar17 ^ auVar1;
  *(undefined1 (*) [16])(out + 0x20) = auVar13 ^ *(undefined1 (*) [16])cv;
  *(undefined1 (*) [16])(out + 0x30) = auVar1 ^ *(undefined1 (*) [16])(cv + 4);
  return;
}

Assistant:

void blake3_compress_xof_sse41(const uint32_t cv[8],
                               const uint8_t block[BLAKE3_BLOCK_LEN],
                               uint8_t block_len, uint64_t counter,
                               uint8_t flags, uint8_t out[64]) {
  __m128i rows[4];
  compress_pre(rows, cv, block, block_len, counter, flags);
  storeu(xorv(rows[0], rows[2]), &out[0]);
  storeu(xorv(rows[1], rows[3]), &out[16]);
  storeu(xorv(rows[2], loadu((uint8_t *)&cv[0])), &out[32]);
  storeu(xorv(rows[3], loadu((uint8_t *)&cv[4])), &out[48]);
}